

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunProgramm.cpp
# Opt level: O0

void __thiscall RunProgramm::RunProgramm(RunProgramm *this,string *file)

{
  string *file_local;
  RunProgramm *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->lexer = (Lexer *)0x0;
  this->parser = (Interpreter *)0x0;
  std::__cxx11::string::operator=((string *)this,(string *)file);
  return;
}

Assistant:

RunProgramm::RunProgramm(string file) {
  this->file_name = file;
}